

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::LegacyReporterAdapter::testCaseEnded
          (LegacyReporterAdapter *this,TestCaseStats *testCaseStats)

{
  IReporter *pIVar1;
  long in_RSI;
  long in_RDI;
  
  if ((*(byte *)(in_RSI + 0x148) & 1) != 0) {
    pIVar1 = Ptr<Catch::IReporter>::operator->((Ptr<Catch::IReporter> *)(in_RDI + 0x10));
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(pIVar1,in_RSI + 8);
  }
  pIVar1 = Ptr<Catch::IReporter>::operator->((Ptr<Catch::IReporter> *)(in_RDI + 0x10));
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[10])
            (pIVar1,in_RSI + 8,in_RSI + 0xe8,in_RSI + 0x108,in_RSI + 0x128);
  return;
}

Assistant:

void LegacyReporterAdapter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        if( testCaseStats.missingAssertions )
            m_legacyReporter->NoAssertionsInTestCase( testCaseStats.testInfo.name );
        m_legacyReporter->EndTestCase
            (   testCaseStats.testInfo,
                testCaseStats.totals,
                testCaseStats.stdOut,
                testCaseStats.stdErr );
    }